

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Builder __thiscall
capnp::_::PointerBuilder::getBlob<capnp::Data>
          (PointerBuilder *this,void *defaultValue,ByteCount defaultSize)

{
  word *pwVar1;
  BuilderArena *this_00;
  SegmentBuilder *this_01;
  ulong uVar2;
  WirePointer *pWVar3;
  CapTableBuilder *capTable;
  word *result;
  WirePointer *__dest;
  uint uVar4;
  WirePointer *ref;
  AllocateResult AVar5;
  Builder BVar6;
  ThrowOverflow local_42;
  anon_class_1_0_00000001 local_41;
  void *local_40;
  CapTableBuilder *local_38;
  
  ref = this->pointer;
  this_01 = this->segment;
  capTable = this->capTable;
  if (0x1fffffff < defaultSize) {
    kj::ThrowOverflow::operator()(&local_42);
  }
  uVar4 = (ref->offsetAndKind).value;
  if ((ref->field_1).structRef != (StructRef)0x0 || uVar4 != 0) {
    local_38 = capTable;
    if ((uVar4 & 3) == 2) {
      this_01 = BuilderArena::getSegment
                          ((BuilderArena *)(this_01->super_SegmentReader).arena,
                           (SegmentId)(ref->field_1).structRef);
      uVar4 = (ref->offsetAndKind).value;
      pwVar1 = (this_01->super_SegmentReader).ptr.ptr;
      uVar2 = (ulong)(uVar4 & 0xfffffff8);
      pWVar3 = (WirePointer *)((long)&pwVar1->content + uVar2);
      ref = (WirePointer *)((long)&pwVar1[1].content + uVar2);
      if ((uVar4 & 4) == 0) {
        __dest = ref + ((int)(pWVar3->offsetAndKind).value >> 2);
        ref = pWVar3;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)(pWVar3->field_1).structRef);
        __dest = (WirePointer *)
                 ((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar3->offsetAndKind).value & 0xfffffff8));
      }
    }
    else {
      __dest = ref + (long)((int)uVar4 >> 2) + 1;
    }
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    if (((ref->offsetAndKind).value & 3) == 1) {
      if (((ref->field_1).upper32Bits & 7) == 2) {
        uVar2 = (ulong)((ref->field_1).upper32Bits >> 3);
        goto LAB_003d8080;
      }
      getBlob<capnp::Data>();
      capTable = local_38;
    }
    else {
      getBlob<capnp::Data>();
      capTable = local_38;
    }
  }
  if (defaultSize == 0) {
    uVar2 = 0;
    __dest = (WirePointer *)0x0;
  }
  else {
    uVar4 = defaultSize + 7 >> 3;
    local_40 = defaultValue;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      WireHelpers::zeroObject(this_01,capTable,ref);
    }
    __dest = (WirePointer *)this_01->pos;
    if (((long)((long)(this_01->super_SegmentReader).ptr.ptr +
               ((this_01->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 <
         (long)(ulong)uVar4) ||
       (this_01->pos = (word *)(__dest + uVar4), __dest == (WirePointer *)0x0)) {
      this_00 = (BuilderArena *)(this_01->super_SegmentReader).arena;
      if (uVar4 == 0x1fffffff) {
        WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_41);
      }
      AVar5 = BuilderArena::allocate(this_00,uVar4 + 1);
      pWVar3 = (WirePointer *)AVar5.words;
      (ref->offsetAndKind).value =
           (int)AVar5.words - *(int *)&((AVar5.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U
           | 2;
      ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                     ((AVar5.segment)->super_SegmentReader).id.value;
      (pWVar3->offsetAndKind).value = 1;
      __dest = pWVar3 + 1;
    }
    else {
      (ref->offsetAndKind).value = ((uint)((ulong)((long)__dest - (long)ref) >> 1) & 0xfffffffc) - 3
      ;
      pWVar3 = ref;
    }
    (pWVar3->field_1).upper32Bits = defaultSize * 8 + 2;
    uVar2 = (ulong)defaultSize;
    memcpy(__dest,local_40,uVar2);
  }
LAB_003d8080:
  BVar6.super_ArrayPtr<unsigned_char>.size_ = uVar2;
  BVar6.super_ArrayPtr<unsigned_char>.ptr = (uchar *)__dest;
  return (Builder)BVar6.super_ArrayPtr<unsigned_char>;
}

Assistant:

Data::Builder PointerBuilder::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) {
  return WireHelpers::getWritableDataPointer(pointer, segment, capTable, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}